

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.h
# Opt level: O2

void __thiscall
kj::_::TupleImpl<kj::_::Indexes<0ul,1ul>,kj::String,kj::StringPtr>::
TupleImpl<kj::String,char_const*>
          (TupleImpl<kj::_::Indexes<0ul,1ul>,kj::String,kj::StringPtr> *this,
          Tuple<kj::String,_const_char_*> *other)

{
  char *__s;
  size_t sVar1;
  
  *(char **)this = (other->impl).super_TupleElement<0U,_kj::String>.value.content.ptr;
  *(size_t *)(this + 8) = (other->impl).super_TupleElement<0U,_kj::String>.value.content.size_;
  *(ArrayDisposer **)(this + 0x10) =
       (other->impl).super_TupleElement<0U,_kj::String>.value.content.disposer;
  (other->impl).super_TupleElement<0U,_kj::String>.value.content.ptr = (char *)0x0;
  (other->impl).super_TupleElement<0U,_kj::String>.value.content.size_ = 0;
  __s = (other->impl).super_TupleElement<1U,_const_char_*>.value;
  sVar1 = strlen(__s);
  *(char **)(this + 0x18) = __s;
  *(size_t *)(this + 0x20) = sVar1 + 1;
  return;
}

Assistant:

constexpr inline TupleImpl(Tuple<U...>&& other)
      : TupleElement<indexes, Types>(kj::fwd<U>(getImpl<indexes>(other)))... {}